

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_coalesce.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformCoalesce(Transformer *this,PGAExpr *root)

{
  unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>_> this_00;
  pointer pOVar1;
  long in_RDX;
  pointer *__ptr;
  PGListCell *pPVar2;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  value_expr;
  templated_unique_single_t coalesce_op;
  optional_ptr<duckdb_libpgquery::PGList,_true> coalesce_args;
  optional_ptr<duckdb::Transformer,_true> local_48;
  _Head_base<0UL,_duckdb::OperatorExpression_*,_false> local_40;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_38;
  optional_ptr<duckdb_libpgquery::PGList,_true> local_30;
  
  local_30.ptr = *(PGList **)(in_RDX + 0x10);
  this_00._M_t.
  super___uniq_ptr_impl<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::OperatorExpression_*,_std::default_delete<duckdb::OperatorExpression>_>
  .super__Head_base<0UL,_duckdb::OperatorExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true,_true>
        )operator_new(0x50);
  local_48.ptr = (Transformer *)0x0;
  local_38._M_head_impl = (ParsedExpression *)0x0;
  OperatorExpression::OperatorExpression
            ((OperatorExpression *)
             this_00._M_t.
             super___uniq_ptr_impl<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::OperatorExpression_*,_std::default_delete<duckdb::OperatorExpression>_>
             .super__Head_base<0UL,_duckdb::OperatorExpression_*,_false>._M_head_impl,
             OPERATOR_COALESCE,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&stack0xffffffffffffffb8,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&stack0xffffffffffffffc8);
  local_40._M_head_impl =
       (OperatorExpression *)
       this_00._M_t.
       super___uniq_ptr_impl<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::OperatorExpression_*,_std::default_delete<duckdb::OperatorExpression>_>
       .super__Head_base<0UL,_duckdb::OperatorExpression_*,_false>._M_head_impl;
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_38._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  local_38._M_head_impl = (ParsedExpression *)0x0;
  if (local_48.ptr != (Transformer *)0x0) {
    (*(code *)(((local_48.ptr)->parent).ptr)->options)();
  }
  optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&stack0xffffffffffffffd0);
  pPVar2 = (local_30.ptr)->head;
  if (pPVar2 != (PGListCell *)0x0) {
    do {
      TransformExpression((Transformer *)&stack0xffffffffffffffb8,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
      pOVar1 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
               ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                             *)&stack0xffffffffffffffc0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pOVar1->children,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&stack0xffffffffffffffb8);
      if (local_48.ptr != (Transformer *)0x0) {
        (*(code *)(((local_48.ptr)->parent).ptr)->options)();
      }
      pPVar2 = pPVar2->next;
    } while (pPVar2 != (PGListCell *)0x0);
  }
  (this->parent).ptr = (Transformer *)local_40._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformCoalesce(duckdb_libpgquery::PGAExpr &root) {
	auto coalesce_args = PGPointerCast<duckdb_libpgquery::PGList>(root.lexpr);
	D_ASSERT(coalesce_args->length > 0); // parser ensures this already

	auto coalesce_op = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_COALESCE);
	for (auto cell = coalesce_args->head; cell; cell = cell->next) {
		// get the value of the COALESCE
		auto value_expr = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(cell->data.ptr_value));
		coalesce_op->children.push_back(std::move(value_expr));
	}
	return std::move(coalesce_op);
}